

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O1

void xmlFreeCatalogEntry(void *payload,xmlChar *name)

{
  long lVar1;
  xmlGenericErrorFunc *pp_Var2;
  void **ppvVar3;
  undefined8 uVar4;
  void *pvVar5;
  xmlGenericErrorFunc p_Var6;
  
  if ((payload == (void *)0x0) || (*(int *)((long)payload + 0x3c) == 1)) {
    return;
  }
  if (xmlDebugCatalogs != 0) {
    if (*(long *)((long)payload + 0x20) == 0) {
      lVar1 = *(long *)((long)payload + 0x28);
      pp_Var2 = __xmlGenericError();
      p_Var6 = *pp_Var2;
      ppvVar3 = __xmlGenericErrorContext();
      pvVar5 = *ppvVar3;
      if (lVar1 == 0) {
        (*p_Var6)(pvVar5,"Free catalog entry\n");
        goto LAB_001392b9;
      }
      uVar4 = *(undefined8 *)((long)payload + 0x28);
    }
    else {
      pp_Var2 = __xmlGenericError();
      p_Var6 = *pp_Var2;
      ppvVar3 = __xmlGenericErrorContext();
      pvVar5 = *ppvVar3;
      uVar4 = *(undefined8 *)((long)payload + 0x20);
    }
    (*p_Var6)(pvVar5,"Free catalog entry %s\n",uVar4);
  }
LAB_001392b9:
  if (*(void **)((long)payload + 0x20) != (void *)0x0) {
    (*xmlFree)(*(void **)((long)payload + 0x20));
  }
  if (*(void **)((long)payload + 0x28) != (void *)0x0) {
    (*xmlFree)(*(void **)((long)payload + 0x28));
  }
  if (*(void **)((long)payload + 0x30) != (void *)0x0) {
    (*xmlFree)(*(void **)((long)payload + 0x30));
  }
  (*xmlFree)(payload);
  return;
}

Assistant:

static void
xmlFreeCatalogEntry(void *payload, const xmlChar *name ATTRIBUTE_UNUSED) {
    xmlCatalogEntryPtr ret = (xmlCatalogEntryPtr) payload;
    if (ret == NULL)
	return;
    /*
     * Entries stored in the file hash must be deallocated
     * only by the file hash cleaner !
     */
    if (ret->dealloc == 1)
	return;

    if (xmlDebugCatalogs) {
	if (ret->name != NULL)
	    xmlGenericError(xmlGenericErrorContext,
		    "Free catalog entry %s\n", ret->name);
	else if (ret->value != NULL)
	    xmlGenericError(xmlGenericErrorContext,
		    "Free catalog entry %s\n", ret->value);
	else
	    xmlGenericError(xmlGenericErrorContext,
		    "Free catalog entry\n");
    }

    if (ret->name != NULL)
	xmlFree(ret->name);
    if (ret->value != NULL)
	xmlFree(ret->value);
    if (ret->URL != NULL)
	xmlFree(ret->URL);
    xmlFree(ret);
}